

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::call_match
          (Dynamic_Object_Constructor *this,Function_Params *vals,
          Type_Conversions_State *t_conversions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  element_type *peVar3;
  int iVar4;
  initializer_list<chaiscript::Boxed_Value> __l;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_vals;
  allocator_type local_d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  Boxed_Value local_b0;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_a0;
  Dynamic_Object local_88;
  
  pcVar2 = (this->m_type_name)._M_dataplus._M_p;
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + (this->m_type_name)._M_string_length);
  paVar1 = &local_88.m_type_name.field_2;
  if (local_d0 == &local_c0) {
    local_88.m_type_name.field_2._8_8_ = local_c0._8_8_;
    local_88.m_type_name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.m_type_name._M_dataplus._M_p = (pointer)local_d0;
  }
  local_88.m_type_name.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_88.m_type_name.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88.m_type_name._M_string_length = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_88.m_option_explicit = false;
  local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = &local_c0;
  local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>(&local_b0,&local_88,false);
  __l._M_len = 1;
  __l._M_array = &local_b0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&local_a0,__l,&local_d1);
  if (local_b0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_88.m_attrs._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_type_name._M_dataplus._M_p,
                    local_88.m_type_name.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
  }
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  _M_range_insert<chaiscript::Boxed_Value_const*>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&local_a0,
             local_a0.
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_finish,vals->m_begin,vals->m_end);
  peVar3 = (this->m_func).
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_88.m_type_name._M_dataplus._M_p =
       (pointer)local_a0.
                super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (local_a0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88.m_type_name._M_dataplus._M_p = (pointer)(pointer)0x0;
  }
  local_88.m_type_name._M_string_length =
       (size_type)
       local_a0.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (local_a0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88.m_type_name._M_string_length = (size_type)(pointer)0x0;
  }
  iVar4 = (*peVar3->_vptr_Proxy_Function_Base[3])(peVar3,&local_88,t_conversions);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_a0)
  ;
  return SUB41(iVar4,0);
}

Assistant:

bool call_match(const chaiscript::Function_Params &vals, const Type_Conversions_State &t_conversions) const override {
          std::vector<Boxed_Value> new_vals{Boxed_Value(Dynamic_Object(m_type_name))};
          new_vals.insert(new_vals.end(), vals.begin(), vals.end());

          return m_func->call_match(chaiscript::Function_Params{new_vals}, t_conversions);
        }